

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  int index;
  uint32_t uVar5;
  uint32_t type;
  iterator iVar6;
  SPIRExpression *pSVar7;
  _func_int **pp_Var8;
  SPIRConstant *c;
  SPIRVariable *var;
  SPIRType *pSVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  CompilerError *this_01;
  undefined7 in_register_00000009;
  char **ts_1;
  ulong uVar12;
  long lVar13;
  string *this_02;
  uint32_t id_local;
  uint32_t dep;
  undefined4 local_64;
  string *local_60;
  undefined1 local_58 [40];
  
  this_00 = &(this->super_Compiler).invalid_expressions;
  id_local = id;
  iVar6 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,&id_local);
  if (iVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    handle_invalid_expression(this,id_local);
  }
  uVar12 = (ulong)id_local;
  if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar12].type ==
      TypeExpression) {
    local_64 = (undefined4)CONCAT71(in_register_00000009,register_expression_read);
    local_60 = __return_storage_ptr__;
    pSVar7 = Compiler::get<spirv_cross::SPIRExpression>(&this->super_Compiler,id_local);
    pTVar1 = (pSVar7->expression_dependencies).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    sVar2 = (pSVar7->expression_dependencies).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    for (lVar13 = 0; sVar2 << 2 != lVar13; lVar13 = lVar13 + 4) {
      dep = *(uint32_t *)((long)&pTVar1->id + lVar13);
      iVar6 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,&dep);
      if (iVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        handle_invalid_expression(this,dep);
      }
    }
    uVar12 = (ulong)id_local;
    register_expression_read = SUB41(local_64,0);
    __return_storage_ptr__ = local_60;
  }
  if (register_expression_read != false) {
    track_expression_read(this,(uint32_t)uVar12);
    uVar12 = (ulong)id_local;
  }
  uVar5 = (uint32_t)uVar12;
  switch((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar12].type) {
  case TypeVariable:
    var = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,uVar5);
    if ((var->statically_assigned != false) ||
       ((var->loop_variable == true && (var->loop_variable_enable == false)))) {
      uVar5 = (var->static_expression).id;
      if ((uVar5 != 0) || (uVar5 = (var->initializer).id, uVar5 != 0)) {
        to_expression_abi_cxx11_(__return_storage_ptr__,this,uVar5,true);
        return __return_storage_ptr__;
      }
      uVar5 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
      type = Compiler::get_variable_data_type_id(&this->super_Compiler,var);
      pSVar7 = emit_uninitialized_temporary_expression(this,type,uVar5);
LAB_002322b4:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pSVar7->expression)
      ;
      return __return_storage_ptr__;
    }
    if (var->deferred_declaration == true) {
      var->deferred_declaration = false;
      (*(this->super_Compiler)._vptr_Compiler[0x27])(__return_storage_ptr__,this,var);
      return __return_storage_ptr__;
    }
    sVar10 = ::std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::count(&(this->flattened_structs)._M_h,&id_local);
    if (sVar10 == 0) {
      pmVar11 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(this->super_Compiler).ir.meta,&(var->super_IVariant).self);
      if ((pmVar11->decoration).builtin == true) {
        (*(this->super_Compiler)._vptr_Compiler[0x14])
                  (__return_storage_ptr__,this,(ulong)(pmVar11->decoration).builtin_type,
                   (ulong)var->storage);
        return __return_storage_ptr__;
      }
      goto LAB_00232270;
    }
    (*(this->super_Compiler)._vptr_Compiler[6])(&dep,this,(ulong)id_local,1);
    pSVar9 = Compiler::get<spirv_cross::SPIRType>
                       (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
    load_flattened_struct(__return_storage_ptr__,this,(string *)&dep,pSVar9);
    break;
  case TypeConstant:
    c = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar5);
    pSVar9 = Compiler::get<spirv_cross::SPIRType>
                       (&this->super_Compiler,*(uint32_t *)&(c->super_IVariant).field_0xc);
    bVar3 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(c->super_IVariant).self.id,DecorationBuiltIn);
    if (bVar3) {
      uVar5 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(c->super_IVariant).self.id,DecorationBuiltIn);
      (*(this->super_Compiler)._vptr_Compiler[0x14])(__return_storage_ptr__,this,(ulong)uVar5,8);
      return __return_storage_ptr__;
    }
    if (c->specialization == true) {
      if (((this->backend).workgroup_size_is_hidden == true) &&
         (index = get_constant_mapping_to_workgroup_component(this,c), -1 < index)) {
        ts_1 = (char **)&DAT_00000001;
        (*(this->super_Compiler)._vptr_Compiler[0x14])((spirv_cross *)&dep,this,0x19);
        local_58._0_8_ = vector_swizzle(1,index);
        join<std::__cxx11::string,char_const*>
                  (__return_storage_ptr__,(spirv_cross *)&dep,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   ts_1);
        ::std::__cxx11::string::~string((string *)&dep);
        if (pSVar9->basetype == UInt) {
          return __return_storage_ptr__;
        }
        bitcast_expression((string *)&dep,this,pSVar9,UInt,__return_storage_ptr__);
        this_02 = (string *)&dep;
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,this_02);
        goto LAB_002320ed;
      }
      bVar3 = expression_is_forwarded(this,id_local);
      if (bVar3) goto LAB_002321f0;
    }
    else if (((c->is_used_as_lut != true) &&
             ((pSVar9->basetype != Struct || ((this->backend).can_declare_struct_inline != false))))
            && (((pSVar9->array).super_VectorView<unsigned_int>.buffer_size == 0 ||
                ((this->backend).can_declare_arrays_inline != false)))) {
LAB_002321f0:
      constant_expression_abi_cxx11_(__return_storage_ptr__,this,c,false,false);
      return __return_storage_ptr__;
    }
LAB_00232270:
    uVar12 = (ulong)id_local;
    pp_Var8 = (this->super_Compiler)._vptr_Compiler;
LAB_00231e84:
    (*pp_Var8[6])(__return_storage_ptr__,this,uVar12,1);
    return __return_storage_ptr__;
  default:
    pp_Var8 = (this->super_Compiler)._vptr_Compiler;
    goto LAB_00231e84;
  case TypeExpression:
    pSVar7 = Compiler::get<spirv_cross::SPIRExpression>(&this->super_Compiler,uVar5);
    uVar5 = *(uint32_t *)&(pSVar7->super_IVariant).field_0xc;
    if (uVar5 == 0) {
      if (pSVar7->need_transpose == true) {
        uVar5 = Compiler::get_extended_decoration
                          (&this->super_Compiler,id_local,SPIRVCrossDecorationPhysicalTypeID);
        bVar3 = Compiler::has_extended_decoration
                          (&this->super_Compiler,id_local,SPIRVCrossDecorationPhysicalTypePacked);
        bVar4 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)id_local,DecorationRelaxedPrecision);
        ::std::__cxx11::string::string((string *)(local_58 + 8),(string *)&pSVar7->expression);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>
                           (&this->super_Compiler,(pSVar7->expression_type).id);
        (*(this->super_Compiler)._vptr_Compiler[0x2a])
                  (__return_storage_ptr__,this,local_58 + 8,pSVar9,(ulong)uVar5,(ulong)bVar3,
                   (uint)bVar4);
        this_02 = (string *)(local_58 + 8);
        goto LAB_002320ed;
      }
      sVar10 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&(this->flattened_structs)._M_h,&id_local);
      if (sVar10 != 0) {
        pSVar9 = Compiler::get<spirv_cross::SPIRType>
                           (&this->super_Compiler,(pSVar7->expression_type).id);
        load_flattened_struct(__return_storage_ptr__,this,&pSVar7->expression,pSVar9);
        return __return_storage_ptr__;
      }
      bVar3 = Compiler::is_forcing_recompilation(&this->super_Compiler);
      if (bVar3) {
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"_",(allocator *)&dep);
        return __return_storage_ptr__;
      }
      goto LAB_002322b4;
    }
    to_enclosed_expression_abi_cxx11_((string *)&dep,this,uVar5,true);
    ::std::operator+(__return_storage_ptr__,(string *)&dep,&pSVar7->expression);
    break;
  case TypeCombinedImageSampler:
    this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_01,"Combined image samplers have no default expression representation.");
    goto LAB_002322f4;
  case TypeAccessChain:
    this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_01,"Access chains have no default expression representation.")
    ;
LAB_002322f4:
    __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_02 = (string *)&dep;
LAB_002320ed:
  ::std::__cxx11::string::~string(this_02);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_expression(uint32_t id, bool register_expression_read)
{
	auto itr = invalid_expressions.find(id);
	if (itr != end(invalid_expressions))
		handle_invalid_expression(id);

	if (ir.ids[id].get_type() == TypeExpression)
	{
		// We might have a more complex chain of dependencies.
		// A possible scenario is that we
		//
		// %1 = OpLoad
		// %2 = OpDoSomething %1 %1. here %2 will have a dependency on %1.
		// %3 = OpDoSomethingAgain %2 %2. Here %3 will lose the link to %1 since we don't propagate the dependencies like that.
		// OpStore %1 %foo // Here we can invalidate %1, and hence all expressions which depend on %1. Only %2 will know since it's part of invalid_expressions.
		// %4 = OpDoSomethingAnotherTime %3 %3 // If we forward all expressions we will see %1 expression after store, not before.
		//
		// However, we can propagate up a list of depended expressions when we used %2, so we can check if %2 is invalid when reading %3 after the store,
		// and see that we should not forward reads of the original variable.
		auto &expr = get<SPIRExpression>(id);
		for (uint32_t dep : expr.expression_dependencies)
			if (invalid_expressions.find(dep) != end(invalid_expressions))
				handle_invalid_expression(dep);
	}

	if (register_expression_read)
		track_expression_read(id);

	switch (ir.ids[id].get_type())
	{
	case TypeExpression:
	{
		auto &e = get<SPIRExpression>(id);
		if (e.base_expression)
			return to_enclosed_expression(e.base_expression) + e.expression;
		else if (e.need_transpose)
		{
			// This should not be reached for access chains, since we always deal explicitly with transpose state
			// when consuming an access chain expression.
			uint32_t physical_type_id = get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
			bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);
			bool relaxed = has_decoration(id, DecorationRelaxedPrecision);
			return convert_row_major_matrix(e.expression, get<SPIRType>(e.expression_type), physical_type_id,
			                                is_packed, relaxed);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(e.expression, get<SPIRType>(e.expression_type));
		}
		else
		{
			if (is_forcing_recompilation())
			{
				// During first compilation phase, certain expression patterns can trigger exponential growth of memory.
				// Avoid this by returning dummy expressions during this phase.
				// Do not use empty expressions here, because those are sentinels for other cases.
				return "_";
			}
			else
				return e.expression;
		}
	}

	case TypeConstant:
	{
		auto &c = get<SPIRConstant>(id);
		auto &type = get<SPIRType>(c.constant_type);

		// WorkGroupSize may be a constant.
		if (has_decoration(c.self, DecorationBuiltIn))
			return builtin_to_glsl(BuiltIn(get_decoration(c.self, DecorationBuiltIn)), StorageClassGeneric);
		else if (c.specialization)
		{
			if (backend.workgroup_size_is_hidden)
			{
				int wg_index = get_constant_mapping_to_workgroup_component(c);
				if (wg_index >= 0)
				{
					auto wg_size = join(builtin_to_glsl(BuiltInWorkgroupSize, StorageClassInput), vector_swizzle(1, wg_index));
					if (type.basetype != SPIRType::UInt)
						wg_size = bitcast_expression(type, SPIRType::UInt, wg_size);
					return wg_size;
				}
			}

			if (expression_is_forwarded(id))
				return constant_expression(c);

			return to_name(id);
		}
		else if (c.is_used_as_lut)
			return to_name(id);
		else if (type.basetype == SPIRType::Struct && !backend.can_declare_struct_inline)
			return to_name(id);
		else if (!type.array.empty() && !backend.can_declare_arrays_inline)
			return to_name(id);
		else
			return constant_expression(c);
	}

	case TypeConstantOp:
		return to_name(id);

	case TypeVariable:
	{
		auto &var = get<SPIRVariable>(id);
		// If we try to use a loop variable before the loop header, we have to redirect it to the static expression,
		// the variable has not been declared yet.
		if (var.statically_assigned || (var.loop_variable && !var.loop_variable_enable))
		{
			// We might try to load from a loop variable before it has been initialized.
			// Prefer static expression and fallback to initializer.
			if (var.static_expression)
				return to_expression(var.static_expression);
			else if (var.initializer)
				return to_expression(var.initializer);
			else
			{
				// We cannot declare the variable yet, so have to fake it.
				uint32_t undef_id = ir.increase_bound_by(1);
				return emit_uninitialized_temporary_expression(get_variable_data_type_id(var), undef_id).expression;
			}
		}
		else if (var.deferred_declaration)
		{
			var.deferred_declaration = false;
			return variable_decl(var);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(to_name(id), get<SPIRType>(var.basetype));
		}
		else
		{
			auto &dec = ir.meta[var.self].decoration;
			if (dec.builtin)
				return builtin_to_glsl(dec.builtin_type, var.storage);
			else
				return to_name(id);
		}
	}

	case TypeCombinedImageSampler:
		// This type should never be taken the expression of directly.
		// The intention is that texture sampling functions will extract the image and samplers
		// separately and take their expressions as needed.
		// GLSL does not use this type because OpSampledImage immediately creates a combined image sampler
		// expression ala sampler2D(texture, sampler).
		SPIRV_CROSS_THROW("Combined image samplers have no default expression representation.");

	case TypeAccessChain:
		// We cannot express this type. They only have meaning in other OpAccessChains, OpStore or OpLoad.
		SPIRV_CROSS_THROW("Access chains have no default expression representation.");

	default:
		return to_name(id);
	}
}